

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode UA_SessionManager_removeSession(UA_SessionManager *sm,UA_NodeId *token)

{
  UA_Boolean UVar1;
  session_list_entry *local_28;
  session_list_entry *current;
  UA_NodeId *token_local;
  UA_SessionManager *sm_local;
  
  local_28 = (sm->sessions).lh_first;
  while ((local_28 != (session_list_entry *)0x0 &&
         (UVar1 = UA_NodeId_equal(&(local_28->session).authenticationToken,token), !UVar1))) {
    local_28 = (local_28->pointers).le_next;
  }
  if (local_28 == (session_list_entry *)0x0) {
    sm_local._4_4_ = 0x80250000;
  }
  else {
    sm_local._4_4_ = removeSession(sm,local_28);
  }
  return sm_local._4_4_;
}

Assistant:

UA_StatusCode
UA_SessionManager_removeSession(UA_SessionManager *sm, const UA_NodeId *token) {
    session_list_entry *current;
    LIST_FOREACH(current, &sm->sessions, pointers) {
        if(UA_NodeId_equal(&current->session.authenticationToken, token))
            break;
    }
    if(!current)
        return UA_STATUSCODE_BADSESSIONIDINVALID;
    return removeSession(sm, current);
}